

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UtestPlatform.cpp
# Opt level: O0

void GccPlatformSpecificRunTestInASeperateProcess
               (UtestShell *shell,TestPlugin *plugin,TestResult *result)

{
  ulong uVar1;
  size_t sVar2;
  int *piVar3;
  TestResult *in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  size_t amountOfRetries;
  size_t initialFailureCount;
  int status;
  pid_t w;
  pid_t cpid;
  pid_t syscallError;
  undefined6 in_stack_fffffffffffffdf8;
  byte in_stack_fffffffffffffdfe;
  byte in_stack_fffffffffffffdff;
  TestFailure *in_stack_fffffffffffffe00;
  SimpleString *in_stack_fffffffffffffe50;
  UtestShell *in_stack_fffffffffffffe58;
  TestFailure *in_stack_fffffffffffffe60;
  undefined1 local_128 [104];
  ulong local_c0;
  ulong local_b8;
  undefined1 local_90 [68];
  int in_stack_ffffffffffffffb4;
  TestResult *in_stack_ffffffffffffffb8;
  UtestShell *in_stack_ffffffffffffffc0;
  uint local_28;
  int local_24;
  int local_20;
  undefined4 local_1c;
  TestResult *local_18;
  undefined8 local_10;
  long *local_8;
  
  local_1c = 0xffffffff;
  local_28 = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_20 = (*PlatformSpecificFork)();
  if (local_20 == -1) {
    SimpleString::SimpleString
              ((SimpleString *)in_stack_fffffffffffffe00,
               (char *)CONCAT17(in_stack_fffffffffffffdff,
                                CONCAT16(in_stack_fffffffffffffdfe,in_stack_fffffffffffffdf8)));
    TestFailure::TestFailure
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
    (*local_18->_vptr_TestResult[0xd])(local_18,local_90);
    TestFailure::~TestFailure(in_stack_fffffffffffffe00);
    SimpleString::~SimpleString((SimpleString *)0x124dce);
  }
  else {
    if (local_20 == 0) {
      local_b8 = TestResult::getFailureCount(local_18);
      (**(code **)(*local_8 + 0x128))(local_8,local_10,local_18);
      uVar1 = local_b8;
      sVar2 = TestResult::getFailureCount(local_18);
      _exit((uint)(uVar1 < sVar2));
    }
    local_c0 = 0;
    do {
      local_24 = (*PlatformSpecificWaitPid)(local_20,(int *)&local_28,2);
      if (local_24 == -1) {
        piVar3 = __errno_location();
        if (*piVar3 != 4) {
          SimpleString::SimpleString
                    ((SimpleString *)local_18,
                     (char *)CONCAT17(in_stack_fffffffffffffdff,
                                      CONCAT16(in_stack_fffffffffffffdfe,in_stack_fffffffffffffdf8))
                    );
          TestFailure::TestFailure
                    (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
          (*local_18->_vptr_TestResult[0xd])(local_18,&stack0xfffffffffffffe60);
          TestFailure::~TestFailure((TestFailure *)local_18);
          SimpleString::~SimpleString((SimpleString *)0x125044);
          return;
        }
        if (0x1e < local_c0) {
          SimpleString::SimpleString
                    ((SimpleString *)in_stack_fffffffffffffe00,
                     (char *)CONCAT17(in_stack_fffffffffffffdff,
                                      CONCAT16(in_stack_fffffffffffffdfe,in_stack_fffffffffffffdf8))
                    );
          TestFailure::TestFailure
                    (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
          (*local_18->_vptr_TestResult[0xd])(local_18,local_128);
          TestFailure::~TestFailure(in_stack_fffffffffffffe00);
          SimpleString::~SimpleString((SimpleString *)0x124f6e);
          return;
        }
        local_c0 = local_c0 + 1;
      }
      else {
        SetTestFailureByStatusCode
                  (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
        if ((local_28 & 0xff) == 0x7f) {
          kill(local_24,0x12);
        }
      }
      in_stack_fffffffffffffdff = 1;
      if ((local_24 != -1) &&
         (in_stack_fffffffffffffdfe = 0, in_stack_fffffffffffffdff = in_stack_fffffffffffffdfe,
         (local_28 & 0x7f) != 0)) {
        in_stack_fffffffffffffdfe = '\0' < (char)(((byte)local_28 & 0x7f) + 1) >> 1 ^ 0xff;
        in_stack_fffffffffffffdff = in_stack_fffffffffffffdfe;
      }
    } while ((in_stack_fffffffffffffdff & 1) != 0);
  }
  return;
}

Assistant:

static void GccPlatformSpecificRunTestInASeperateProcess(UtestShell* shell, TestPlugin* plugin, TestResult* result)
{
    const pid_t syscallError = -1;
    pid_t cpid;
    pid_t w;
    int status = 0;

    cpid = PlatformSpecificFork();

    if (cpid == syscallError) {
        result->addFailure(TestFailure(shell, "Call to fork() failed"));
        return;
    }

    if (cpid == 0) {            /* Code executed by child */
        const size_t initialFailureCount = result->getFailureCount(); // LCOV_EXCL_LINE
        shell->runOneTestInCurrentProcess(plugin, *result);        // LCOV_EXCL_LINE
        _exit(initialFailureCount < result->getFailureCount());    // LCOV_EXCL_LINE
    } else {                    /* Code executed by parent */
        size_t amountOfRetries = 0;
        do {
            w = PlatformSpecificWaitPid(cpid, &status, WUNTRACED);
            if (w == syscallError) {
                // OS X debugger causes EINTR
                if (EINTR == errno) {
                  if (amountOfRetries > 30) {
                    result->addFailure(TestFailure(shell, "Call to waitpid() failed with EINTR. Tried 30 times and giving up! Sometimes happens in debugger"));
                    return;
                  }
                  amountOfRetries++;
                }
                else {
                    result->addFailure(TestFailure(shell, "Call to waitpid() failed"));
                    return;
                }
            } else {
                SetTestFailureByStatusCode(shell, result, status);
                if (WIFSTOPPED(status)) kill(w, SIGCONT);
            }
        } while ((w == syscallError) || (!WIFEXITED(status) && !WIFSIGNALED(status)));
    }
}